

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Parser::IncludePath>::relocate
          (QArrayDataPointer<Parser::IncludePath> *this,qsizetype offset,IncludePath **data)

{
  bool bVar1;
  char *n;
  IncludePath *in_RDX;
  long in_RSI;
  IncludePath *in_RDI;
  IncludePath **unaff_retaddr;
  IncludePath *res;
  IncludePath *c;
  
  n = (in_RDI->path).d.ptr + in_RSI * 0x20;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<Parser::IncludePath,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (IncludePath *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<Parser::IncludePath>,Parser::IncludePath_const*>
                        (unaff_retaddr,(QArrayDataPointer<Parser::IncludePath> *)c), bVar1)) {
    (in_RDX->path).d.d = (in_RDX->path).d.d + in_RSI * 2;
  }
  (in_RDI->path).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }